

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_http_req_handler.c
# Opt level: O0

_Bool uo_http_req_handler_try
                (uo_http_req_handler *http_req_handler,char *method_sp_uri,uo_strhashtbl *params,
                uo_refstack *refstack)

{
  char cVar1;
  long lVar2;
  size_t str1;
  uo_refstack *hashtbl;
  uo_strhashtbl *puVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char *value;
  undefined8 uStack_b0;
  char *local_a8;
  long local_a0;
  _Bool local_91;
  char *local_90;
  char *param_name;
  char *param_value;
  char *param_value_buf;
  char *first_param_value;
  char *p_1;
  char *local_60;
  char *param_start;
  unsigned_long __vla_expr0;
  char *p;
  size_t i;
  char *req_pattern;
  uo_refstack *refstack_local;
  uo_strhashtbl *params_local;
  char *method_sp_uri_local;
  uo_http_req_handler *http_req_handler_local;
  
  __vla_expr0 = (unsigned_long)&local_a8;
  i = (size_t)http_req_handler->req_pattern;
  p = (char *)http_req_handler->param_count;
  req_pattern = (char *)refstack;
  refstack_local = (uo_refstack *)params;
  params_local = (uo_strhashtbl *)method_sp_uri;
  method_sp_uri_local = (char *)http_req_handler;
  if (p == (char *)0x0) {
    uStack_b0 = 0x107e17;
    pcVar4 = uo_strdiff((char *)i,method_sp_uri);
    local_91 = true;
    if (pcVar4 != (char *)0x0) {
      local_91 = *pcVar4 == '*';
    }
    http_req_handler_local._7_1_ = local_91;
  }
  else {
    param_start = (char *)((long)p * 3);
    lVar2 = -((long)p * 0x18 + 0xfU & 0xfffffffffffffff0);
    local_a0 = (long)&local_a8 + lVar2;
    while (puVar3 = params_local, str1 = i, p != (char *)0x0) {
      p = p + -1;
      *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x107ea2;
      pcVar4 = uo_strdiff((char *)str1,(char *)puVar3);
      if (*pcVar4 != '{') {
        return false;
      }
      *(char **)(local_a0 + (long)p * 0x18) = pcVar4 + 1;
      params_local = (uo_strhashtbl *)(((long)pcVar4 - i) + (long)params_local);
      *(uo_strhashtbl **)(local_a0 + 8 + (long)p * 0x18) = params_local;
      local_a8 = pcVar4;
      local_60 = pcVar4;
      *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x107f0b;
      sVar5 = strlen(pcVar4);
      puVar3 = params_local;
      i = (size_t)(local_a8 + sVar5 + 1);
      cVar1 = *(char *)i;
      *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x107f30;
      params_local = (uo_strhashtbl *)strchr((char *)puVar3,(int)cVar1);
      if (params_local == (uo_strhashtbl *)0x0) {
        return false;
      }
      *(uo_strhashtbl **)(local_a0 + 0x10 + (long)p * 0x18) = params_local;
    }
    p = p + -1;
    *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x107f72;
    first_param_value = uo_strdiff((char *)str1,(char *)puVar3);
    if ((first_param_value == (char *)0x0) || (*first_param_value == '*')) {
      p = *(char **)(method_sp_uri_local + 0x18);
      pcVar4 = *(char **)(local_a0 + 8 + (long)(p + -1) * 0x18);
      param_value_buf = pcVar4;
      *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x107fca;
      pcVar6 = strdup(pcVar4);
      pcVar4 = req_pattern;
      param_value = pcVar6;
      *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x107fe2;
      uo_refstack_push((uo_refstack *)pcVar4,pcVar6,free);
      while (hashtbl = refstack_local, pcVar4 = p + -1, p != (char *)0x0) {
        value = param_value +
                (*(long *)(local_a0 + 8 + (long)pcVar4 * 0x18) - (long)param_value_buf);
        param_value[*(long *)(local_a0 + 0x10 + (long)pcVar4 * 0x18) - (long)param_value_buf] = '\0'
        ;
        pcVar6 = *(char **)(local_a0 + (long)pcVar4 * 0x18);
        local_90 = pcVar6;
        param_name = value;
        p = pcVar4;
        *(undefined8 *)((long)&uStack_b0 + lVar2) = 0x108057;
        uo_strhashtbl_set((uo_strhashtbl *)hashtbl,pcVar6,value);
      }
      http_req_handler_local._7_1_ = true;
    }
    else {
      http_req_handler_local._7_1_ = false;
    }
  }
  return http_req_handler_local._7_1_;
}

Assistant:

bool uo_http_req_handler_try(
    uo_http_req_handler *http_req_handler,
    const char *method_sp_uri,
    uo_strhashtbl *params,
    uo_refstack *refstack)
{
    char *req_pattern = http_req_handler->req_pattern;
    size_t i = http_req_handler->param_count;

    if (i == 0)
    {
        // request line is checked for exact match or prefix match
        char *p = uo_strdiff(req_pattern, method_sp_uri);
        return !p || *p == '*';
    }

    // temporary array for pattern parameter name start, value start and value end pointers
    char *param_ptrs[i * 3];

    while (i--)
    {
        // find pattern parameter
        char *param_start = uo_strdiff(req_pattern, method_sp_uri);

        if (*param_start != '{')
            return false;

        // store pattern parameter name pointer
        param_ptrs[i * 3] = param_start + 1;

        // store matched pattern parameter value start pointer
        param_ptrs[i * 3 + 1] = (char *)(method_sp_uri += param_start - req_pattern);

        // skip pattern parameter name
        req_pattern = param_start + strlen(param_start) + 1;

        // find pattern parameter value end
        method_sp_uri = strchr(method_sp_uri, *req_pattern);

        if (!method_sp_uri)
            return false;

        // store matched pattern parameter end pointer
        param_ptrs[i * 3 + 2] = (char *)method_sp_uri;
    }

    {
        // chech if the request line end either a exact match or a prefix match
        char *p = uo_strdiff(req_pattern, method_sp_uri);
        if (p && *p != '*')
            return false;
    }

    // req_handler matches the request method and URI
    // now store the pattern parameters

    i = http_req_handler->param_count;
    char *first_param_value = param_ptrs[(i - 1) * 3 + 1];
    char *param_value_buf = strdup(first_param_value);
    uo_refstack_push(refstack, param_value_buf, free);

    while (i--)
    {
        // null terminate parameter value
        char *param_value = param_value_buf + (param_ptrs[i * 3 + 1] - first_param_value);
        param_value_buf[param_ptrs[i * 3 + 2] - first_param_value] = '\0';

        // get parameter name
        char *param_name = param_ptrs[i * 3];

        // store parameter name and value
        uo_strhashtbl_set(params, param_name, param_value);
    }

    return true;
}